

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qminimalbackingstore.cpp
# Opt level: O2

void __thiscall
QMinimalBackingStore::resize(QMinimalBackingStore *this,QSize *size,QRegion *param_2)

{
  Format FVar1;
  long *plVar2;
  undefined8 uVar3;
  long in_FS_OFFSET;
  QImage local_40 [24];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  QGuiApplication::primaryScreen();
  plVar2 = (long *)QScreen::handle();
  FVar1 = (**(code **)(*plVar2 + 0x38))(plVar2);
  uVar3 = QImage::size();
  if (((size->wd).m_i != (int)uVar3) || ((size->ht).m_i != (int)((ulong)uVar3 >> 0x20))) {
    QImage::QImage(local_40,size,FVar1);
    QImage::operator=(&this->mImage,local_40);
    QImage::~QImage(local_40);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMinimalBackingStore::resize(const QSize &size, const QRegion &)
{
    QImage::Format format = QGuiApplication::primaryScreen()->handle()->format();
    if (mImage.size() != size)
        mImage = QImage(size, format);
}